

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cpp
# Opt level: O0

int SHA1_Update(SHA_CTX *c,void *data,size_t len)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  size_t j;
  size_t i;
  ulong local_28;
  size_t local_20;
  
  uVar1 = c->Nl;
  uVar2 = c->Nl + (int)(len << 3);
  c->Nl = uVar2;
  if (uVar2 < uVar1) {
    c->Nh = c->Nh + 1;
  }
  c->Nh = c->Nh + (int)(len >> 0x1d);
  local_28 = (ulong)(uVar1 >> 3) & 0x3f;
  if (local_28 + len < 0x40) {
    local_20 = 0;
  }
  else {
    local_20 = 0x40 - local_28;
    memcpy((void *)((long)c->data + local_28),data,local_20);
    SHA1_Transform(&c->h0,(uint8_t *)c->data);
    for (; local_20 + 0x3f < len; local_20 = local_20 + 0x40) {
      SHA1_Transform(&c->h0,(uint8_t *)((long)data + local_20));
    }
    local_28 = 0;
  }
  pvVar3 = memcpy((void *)((long)c->data + local_28),(void *)((long)data + local_20),len - local_20)
  ;
  return (int)pvVar3;
}

Assistant:

void SHA1_Update(SHA1_CTX *context, const uint8_t *data, const size_t len) {
  size_t i, j;

  j = context->count[0];
  if ((context->count[0] += len << 3) < j)
    context->count[1]++;
  context->count[1] += (len >> 29);
  j = (j >> 3) & 63;
  if ((j + len) > 63) {
    memcpy(&context->buffer[j], data, (i = 64 - j));
    SHA1_Transform(context->state, context->buffer);
    for (; i + 63 < len; i += 64) {
      SHA1_Transform(context->state, &data[i]);
    }
    j = 0;
  } else
    i = 0;
  memcpy(&context->buffer[j], &data[i], len - i);
}